

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.h
# Opt level: O0

void __thiscall icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo(ParsedPatternInfo *this)

{
  ParsedPatternInfo *this_local;
  
  AffixPatternProvider::AffixPatternProvider(&this->super_AffixPatternProvider);
  (this->super_AffixPatternProvider)._vptr_AffixPatternProvider =
       (_func_int **)&PTR__ParsedPatternInfo_0049feb0;
  UnicodeString::UnicodeString(&this->pattern);
  ParsedSubpatternInfo::ParsedSubpatternInfo(&this->positive);
  ParsedSubpatternInfo::ParsedSubpatternInfo(&this->negative);
  ParserState::ParserState(&this->state,&this->pattern);
  this->currentSubpattern = (ParsedSubpatternInfo *)0x0;
  this->fHasNegativeSubpattern = false;
  return;
}

Assistant:

~ParsedPatternInfo() U_OVERRIDE = default;